

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

void __thiscall
soplex::SPxScaler<double>::getColUnscaled
          (SPxScaler<double> *this,SPxLPBase<double> *lp,int i,DSVectorBase<double> *vec)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Item *pIVar5;
  Nonzero<double> *pNVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  DSVectorBase<double>::operator=
            (vec,(SVectorBase<double> *)
                 ((lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[i].idx));
  iVar1 = (lp->super_LPColSetBase<double>).scaleExp.data[i];
  pIVar5 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
  iVar2 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[i].idx;
  iVar3 = pIVar5[iVar2].data.super_SVectorBase<double>.memused;
  iVar4 = (vec->super_SVectorBase<double>).memused;
  if (iVar3 < iVar4) {
    iVar3 = iVar4;
  }
  spx_realloc<soplex::Nonzero<double>*>(&vec->theelem,iVar3);
  (vec->super_SVectorBase<double>).m_elem = vec->theelem;
  (vec->super_SVectorBase<double>).memused = 0;
  (vec->super_SVectorBase<double>).memsize = iVar3;
  if (0 < pIVar5[iVar2].data.super_SVectorBase<double>.memused) {
    lVar8 = 8;
    lVar7 = 0;
    do {
      pNVar6 = pIVar5[iVar2].data.super_SVectorBase<double>.m_elem;
      iVar3 = *(int *)((long)&pNVar6->val + lVar8);
      dVar9 = ldexp(*(double *)((long)pNVar6 + lVar8 + -8),
                    -((lp->super_LPRowSetBase<double>).scaleExp.data[iVar3] + iVar1));
      DSVectorBase<double>::makeMem(vec,1);
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        iVar4 = (vec->super_SVectorBase<double>).memused;
        pNVar6 = (vec->super_SVectorBase<double>).m_elem;
        pNVar6[iVar4].idx = iVar3;
        pNVar6[iVar4].val = dVar9;
        (vec->super_SVectorBase<double>).memused = iVar4 + 1;
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar7 < pIVar5[iVar2].data.super_SVectorBase<double>.memused);
  }
  return;
}

Assistant:

void SPxScaler<R>::getColUnscaled(const SPxLPBase<R>& lp, int i, DSVectorBase<R>& vec) const
{
   assert(lp.isScaled());
   assert(i < lp.nCols());
   assert(i >= 0);
   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   vec = lp.LPColSetBase<R>::colVector(i);

   int exp1;
   int exp2 = colscaleExp[i];

   const SVectorBase<R>& col = lp.colVector(i);
   vec.setMax(col.size());
   vec.clear();

   for(int j = 0; j < col.size(); j++)
   {
      exp1 = rowscaleExp[col.index(j)];
      vec.add(col.index(j), spxLdexp(col.value(j), -exp1 - exp2));
   }
}